

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log<std::__cxx11::string>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  memory_buf_t buf;
  log_msg log_msg;
  undefined **local_1b8;
  char *local_1b0;
  size_t local_1a8;
  ulong local_1a0;
  char local_198 [256];
  log_msg local_98;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_1b0 = local_198;
    local_1a8 = 0;
    local_1b8 = &PTR_grow_001c7590;
    local_1a0 = 0xfa;
    local_98.logger_name.data_ = (args->_M_dataplus)._M_p;
    local_98.logger_name.size_ = args->_M_string_length;
    args_00.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_98;
    args_00.types_ = 0xe;
    ::fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)&local_1b8,fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_1a8;
    msg.data_ = local_1b0;
    details::log_msg::log_msg(&local_98,loc,a_logger_name,lvl,msg);
    log_it_(this,&local_98,iVar1 <= (int)lvl,traceback_enabled);
    local_1b8 = &PTR_grow_001c7590;
    if (local_1b0 != local_198) {
      operator_delete(local_1b0,local_1a0);
    }
  }
  return;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }